

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ulist.cpp
# Opt level: O0

void ulist_addItemBeginList_63(UList *list,void *data,UBool forceDelete,UErrorCode *status)

{
  UBool UVar1;
  UListNode *newItem_00;
  UListNode *newItem;
  UErrorCode *status_local;
  UBool forceDelete_local;
  void *data_local;
  UList *list_local;
  
  UVar1 = U_FAILURE(*status);
  if (((UVar1 == '\0') && (list != (UList *)0x0)) && (data != (void *)0x0)) {
    newItem_00 = (UListNode *)uprv_malloc_63(0x20);
    if (newItem_00 == (UListNode *)0x0) {
      if (forceDelete != '\0') {
        uprv_free_63(data);
      }
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      newItem_00->data = data;
      newItem_00->forceDelete = forceDelete;
      if (list->size == 0) {
        ulist_addFirstItem(list,newItem_00);
      }
      else {
        newItem_00->previous = (UListNode *)0x0;
        newItem_00->next = list->head;
        list->head->previous = newItem_00;
        list->head = newItem_00;
      }
      list->size = list->size + 1;
    }
  }
  else if (forceDelete != '\0') {
    uprv_free_63(data);
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2 ulist_addItemBeginList(UList *list, const void *data, UBool forceDelete, UErrorCode *status) {
    UListNode *newItem = NULL;
    
    if (U_FAILURE(*status) || list == NULL || data == NULL) {
        if (forceDelete) {
            uprv_free((void *)data);
        }
        return;
    }
    
    newItem = (UListNode *)uprv_malloc(sizeof(UListNode));
    if (newItem == NULL) {
        if (forceDelete) {
            uprv_free((void *)data);
        }
        *status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    newItem->data = (void *)(data);
    newItem->forceDelete = forceDelete;
    
    if (list->size == 0) {
        ulist_addFirstItem(list, newItem);
    } else {
        newItem->previous = NULL;
        newItem->next = list->head;
        list->head->previous = newItem;
        list->head = newItem;
    }
    
    list->size++;
}